

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-xref.c
# Opt level: O3

pdf_xref_entry * pdf_xref_find_subsection(hd_context *ctx,pdf_document *doc,int start,int len)

{
  int iVar1;
  pdf_xref *ppVar2;
  hd_error_stack_slot *phVar3;
  int iVar4;
  pdf_xref_subsec *p;
  pdf_xref_entry *ppVar5;
  int num;
  
  ppVar2 = doc->xref_sections;
  iVar1 = doc->num_xref_sections;
  p = ppVar2[(long)iVar1 + -1].subsec;
  num = len + start;
  do {
    if (p == (pdf_xref_subsec *)0x0) {
      if (num < ppVar2[(long)iVar1 + -1].num_objects) {
        num = ppVar2[(long)iVar1 + -1].num_objects;
      }
      p = (pdf_xref_subsec *)hd_calloc(ctx,1,0x18);
      iVar4 = hd_push_try(ctx);
      if ((iVar4 != 0) && (iVar4 = __sigsetjmp(ctx->error->top->buffer,0), iVar4 == 0)) {
        ppVar5 = (pdf_xref_entry *)hd_calloc(ctx,(ulong)(uint)len,0x20);
        p->table = ppVar5;
        p->start = start;
        p->len = len;
        p->next = ppVar2[(long)iVar1 + -1].subsec;
        ppVar2[(long)iVar1 + -1].subsec = p;
      }
      phVar3 = ctx->error->top;
      ctx->error->top = phVar3 + -1;
      if (1 < phVar3->code) {
        hd_free(ctx,p);
        hd_rethrow(ctx);
      }
      ppVar2[(long)iVar1 + -1].num_objects = num;
      if (doc->max_xref_len < num) {
        extend_xref_index(ctx,doc,num);
      }
LAB_0010b530:
      iVar4 = p->start;
LAB_0010b534:
      return p->table + (start - iVar4);
    }
    iVar4 = p->start;
    if ((iVar4 <= start) && (num <= p->len + iVar4)) goto LAB_0010b534;
    if ((iVar4 < num) && (start <= iVar4 + p->len)) {
      if (num < ppVar2[(long)iVar1 + -1].num_objects) {
        num = ppVar2[(long)iVar1 + -1].num_objects;
      }
      ensure_solid_xref(ctx,doc,num,iVar1 + -1);
      p = doc->xref_sections[(long)doc->num_xref_sections + -1].subsec;
      goto LAB_0010b530;
    }
    p = p->next;
  } while( true );
}

Assistant:

static pdf_xref_entry *
pdf_xref_find_subsection(hd_context *ctx, pdf_document *doc, int start, int len)
{
	pdf_xref *xref = &doc->xref_sections[doc->num_xref_sections-1];
	pdf_xref_subsec *sub;
	int num_objects;

	/* Different cases here. Case 1) We might be asking for a
	 * subsection (or a subset of a subsection) that we already
	 * have - Just return it. Case 2) We might be asking for a
	 * completely new subsection - Create it and return it.
	 * Case 3) We might have an overlapping one - Create a 'solid'
	 * subsection and return that. */

	/* Sanity check */
	for (sub = xref->subsec; sub != NULL; sub = sub->next)
	{
		if (start >= sub->start && start + len <= sub->start + sub->len)
			return &sub->table[start-sub->start]; /* Case 1 */
		if (start + len > sub->start && start <= sub->start + sub->len)
			break; /* Case 3 */
	}

	num_objects = xref->num_objects;
	if (num_objects < start + len)
		num_objects = start + len;

	if (sub == NULL)
	{
		/* Case 2 */
		sub = hd_malloc_struct(ctx, pdf_xref_subsec);
		hd_try(ctx)
		{
			sub->table = hd_calloc(ctx, len, sizeof(pdf_xref_entry));
			sub->start = start;
			sub->len = len;
			sub->next = xref->subsec;
			xref->subsec = sub;
		}
		hd_catch(ctx)
		{
			hd_free(ctx, sub);
			hd_rethrow(ctx);
		}
		xref->num_objects = num_objects;
		if (doc->max_xref_len < num_objects)
			extend_xref_index(ctx, doc, num_objects);
	}
	else
	{
		/* Case 3 */
		ensure_solid_xref(ctx, doc, num_objects, doc->num_xref_sections-1);
		xref = &doc->xref_sections[doc->num_xref_sections-1];
		sub = xref->subsec;
	}
	return &sub->table[start-sub->start];
}